

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codeholder.cpp
# Opt level: O2

void asmjit::CodeHolder_resetInternal(CodeHolder *self,uint32_t resetPolicy)

{
  uint uVar1;
  Section *pSVar2;
  uint8_t *__ptr;
  BaseEmitter **ppBVar3;
  Section **ppSVar4;
  ulong i;
  size_t i_00;
  
  i = (ulong)(self->_emitters).super_ZoneVectorBase._size;
  while (i = i - 1, i != 0xffffffffffffffff) {
    ppBVar3 = ZoneVector<asmjit::BaseEmitter_*>::operator[](&self->_emitters,i);
    CodeHolder::detach(self,*ppBVar3);
  }
  (self->_environment)._arch = '\0';
  (self->_environment)._subArch = '\0';
  (self->_environment)._vendor = '\0';
  (self->_environment)._platform = '\0';
  (self->_environment)._abi = '\0';
  (self->_environment)._format = '\0';
  (self->_environment)._reserved = 0;
  self->_baseAddress = 0xffffffffffffffff;
  self->_logger = (Logger *)0x0;
  self->_errorHandler = (ErrorHandler *)0x0;
  uVar1 = (self->_sections).super_ZoneVectorBase._size;
  for (i_00 = 0; uVar1 != i_00; i_00 = i_00 + 1) {
    ppSVar4 = ZoneVector<asmjit::Section_*>::operator[](&self->_sections,i_00);
    pSVar2 = *ppSVar4;
    __ptr = (pSVar2->_buffer)._data;
    if ((__ptr != (uint8_t *)0x0) && (((pSVar2->_buffer)._flags & 1) == 0)) {
      free(__ptr);
    }
    (pSVar2->_buffer)._data = (uint8_t *)0x0;
    (pSVar2->_buffer)._capacity = 0;
  }
  (self->_emitters).super_ZoneVectorBase._data = (void *)0x0;
  (self->_emitters).super_ZoneVectorBase._size = 0;
  (self->_emitters).super_ZoneVectorBase._capacity = 0;
  ZoneHashBase::reset(&(self->_namedLabels).super_ZoneHashBase);
  (self->_relocations).super_ZoneVectorBase._data = (void *)0x0;
  (self->_relocations).super_ZoneVectorBase._size = 0;
  (self->_relocations).super_ZoneVectorBase._capacity = 0;
  (self->_labelEntries).super_ZoneVectorBase._data = (void *)0x0;
  (self->_labelEntries).super_ZoneVectorBase._size = 0;
  (self->_labelEntries).super_ZoneVectorBase._capacity = 0;
  (self->_sectionsByOrder).super_ZoneVectorBase._data = (void *)0x0;
  (self->_sectionsByOrder).super_ZoneVectorBase._size = 0;
  (self->_sectionsByOrder).super_ZoneVectorBase._capacity = 0;
  (self->_sections).super_ZoneVectorBase._data = (void *)0x0;
  (self->_sections).super_ZoneVectorBase._size = 0;
  (self->_sections).super_ZoneVectorBase._capacity = 0;
  self->_unresolvedLinkCount = 0;
  self->_addressTableSection = (Section *)0x0;
  (self->_addressTableEntries)._root = (AddressTableEntry *)0x0;
  ZoneAllocator::reset(&self->_allocator,&self->_zone);
  Zone::reset(&self->_zone,resetPolicy);
  return;
}

Assistant:

static void CodeHolder_resetInternal(CodeHolder* self, uint32_t resetPolicy) noexcept {
  uint32_t i;
  const ZoneVector<BaseEmitter*>& emitters = self->emitters();

  i = emitters.size();
  while (i)
    self->detach(emitters[--i]);

  // Reset everything into its construction state.
  self->_environment.reset();
  self->_baseAddress = Globals::kNoBaseAddress;
  self->_logger = nullptr;
  self->_errorHandler = nullptr;

  // Reset all sections.
  uint32_t numSections = self->_sections.size();
  for (i = 0; i < numSections; i++) {
    Section* section = self->_sections[i];
    if (section->_buffer.data() && !section->_buffer.isExternal())
      ::free(section->_buffer._data);
    section->_buffer._data = nullptr;
    section->_buffer._capacity = 0;
  }

  // Reset zone allocator and all containers using it.
  ZoneAllocator* allocator = self->allocator();

  self->_emitters.reset();
  self->_namedLabels.reset();
  self->_relocations.reset();
  self->_labelEntries.reset();
  self->_sections.reset();
  self->_sectionsByOrder.reset();

  self->_unresolvedLinkCount = 0;
  self->_addressTableSection = nullptr;
  self->_addressTableEntries.reset();

  allocator->reset(&self->_zone);
  self->_zone.reset(resetPolicy);
}